

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascReadFile.cpp
# Opt level: O2

DWORD CascGetFileSize(HANDLE hFile,PDWORD pdwFileSizeHigh)

{
  DWORD DVar1;
  TCascFile *hf;
  
  hf = IsValidCascFileHandle(hFile);
  if (hf == (TCascFile *)0x0) {
    DVar1 = 9;
LAB_00114e31:
    SetLastError(DVar1);
    DVar1 = 0xffffffff;
  }
  else {
    DVar1 = hf->ContentSize;
    if (DVar1 == 0xffffffff) {
      DVar1 = EnsureFileFramesLoaded(hf);
      if (DVar1 != 0) goto LAB_00114e31;
      DVar1 = hf->ContentSize;
      if (DVar1 == 0xffffffff) {
        __assert_fail("hf->ContentSize != CASC_INVALID_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/CascReadFile.cpp"
                      ,0x267,"DWORD CascGetFileSize(HANDLE, PDWORD)");
      }
    }
    if (pdwFileSizeHigh != (PDWORD)0x0) {
      *pdwFileSizeHigh = 0;
      DVar1 = hf->ContentSize;
    }
  }
  return DVar1;
}

Assistant:

DWORD WINAPI CascGetFileSize(HANDLE hFile, PDWORD pdwFileSizeHigh)
{
    TCascFile * hf;
    int nError;

    CASCLIB_UNUSED(pdwFileSizeHigh);

    // Validate the file handle
    if((hf = IsValidCascFileHandle(hFile)) == NULL)
    {
        SetLastError(ERROR_INVALID_HANDLE);
        return CASC_INVALID_SIZE;
    }

    // Someone may have provided file content size.
    // If yes, do not load the frames, as it's not necessary.
    if(hf->ContentSize == CASC_INVALID_SIZE)
    {
        // Make sure that the file header area is loaded
        nError = EnsureFileFramesLoaded(hf);
        if(nError != ERROR_SUCCESS)
        {
            SetLastError(nError);
            return CASC_INVALID_SIZE;
        }

        // The content size should be loaded from the frames
        assert(hf->ContentSize != CASC_INVALID_SIZE);
    }

    // Give the file size to the caller
    if(pdwFileSizeHigh != NULL)
        *pdwFileSizeHigh = 0;
    return hf->ContentSize;
}